

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Steiner.cpp
# Opt level: O0

void __thiscall Steiner::outfile(Steiner *this,string *outfileName)

{
  bool bVar1;
  ostream *poVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  string *in_RSI;
  long in_RDI;
  reference rVar9;
  Point *p2_1;
  Point *p1_1;
  uint i_1;
  Point *p2;
  Point *p1;
  uint i;
  ofstream of;
  size_type in_stack_fffffffffffffbd8;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffbe0;
  uint local_244;
  reference local_230;
  uint local_220;
  ostream local_210 [528];
  
  std::ofstream::ofstream(local_210,in_RSI,_S_out);
  poVar2 = std::operator<<(local_210,"NumRoutedPins = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)(in_RDI + 0x30));
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(local_210,"WireLength = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(longlong *)(in_RDI + 0x1c8));
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_220 = 0;
  while( true ) {
    uVar3 = (ulong)local_220;
    sVar4 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x80));
    if (sVar4 <= uVar3) break;
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x80),(ulong)local_220);
    rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
    local_230 = rVar9;
    bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_230);
    if (!bVar1) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x80),(ulong)local_220);
      pvVar6 = std::vector<Edge,_std::allocator<Edge>_>::operator[]
                         ((vector<Edge,_std::allocator<Edge>_> *)(in_RDI + 0x50),(long)*pvVar5);
      pvVar7 = std::vector<Point,_std::allocator<Point>_>::operator[]
                         ((vector<Point,_std::allocator<Point>_> *)(in_RDI + 0x38),(long)pvVar6->p1)
      ;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x80),(ulong)local_220);
      pvVar6 = std::vector<Edge,_std::allocator<Edge>_>::operator[]
                         ((vector<Edge,_std::allocator<Edge>_> *)(in_RDI + 0x50),(long)*pvVar5);
      pvVar8 = std::vector<Point,_std::allocator<Point>_>::operator[]
                         ((vector<Point,_std::allocator<Point>_> *)(in_RDI + 0x38),(long)pvVar6->p2)
      ;
      if (pvVar7->x != pvVar8->x) {
        poVar2 = std::operator<<(local_210,"H-line ");
        poVar2 = std::operator<<(poVar2,"(");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,pvVar7->x);
        poVar2 = std::operator<<(poVar2,",");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,pvVar7->y);
        poVar2 = std::operator<<(poVar2,") ");
        poVar2 = std::operator<<(poVar2,"(");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,pvVar8->x);
        poVar2 = std::operator<<(poVar2,",");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,pvVar7->y);
        poVar2 = std::operator<<(poVar2,")");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      if (pvVar7->y != pvVar8->y) {
        poVar2 = std::operator<<(local_210,"V-line ");
        poVar2 = std::operator<<(poVar2,"(");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,pvVar8->x);
        poVar2 = std::operator<<(poVar2,",");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,pvVar7->y);
        poVar2 = std::operator<<(poVar2,") ");
        poVar2 = std::operator<<(poVar2,"(");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,pvVar8->x);
        poVar2 = std::operator<<(poVar2,",");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,pvVar8->y);
        poVar2 = std::operator<<(poVar2,")");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
    }
    local_220 = local_220 + 1;
  }
  local_244 = 0;
  while( true ) {
    sVar4 = std::vector<Edge,_std::allocator<Edge>_>::size
                      ((vector<Edge,_std::allocator<Edge>_> *)(in_RDI + 0x1a8));
    if (sVar4 <= local_244) break;
    pvVar6 = std::vector<Edge,_std::allocator<Edge>_>::operator[]
                       ((vector<Edge,_std::allocator<Edge>_> *)(in_RDI + 0x1a8),(ulong)local_244);
    pvVar7 = std::vector<Point,_std::allocator<Point>_>::operator[]
                       ((vector<Point,_std::allocator<Point>_> *)(in_RDI + 0x38),(long)pvVar6->p1);
    pvVar6 = std::vector<Edge,_std::allocator<Edge>_>::operator[]
                       ((vector<Edge,_std::allocator<Edge>_> *)(in_RDI + 0x1a8),(ulong)local_244);
    pvVar8 = std::vector<Point,_std::allocator<Point>_>::operator[]
                       ((vector<Point,_std::allocator<Point>_> *)(in_RDI + 0x38),(long)pvVar6->p2);
    if (pvVar7->x != pvVar8->x) {
      poVar2 = std::operator<<(local_210,"H-line ");
      poVar2 = std::operator<<(poVar2,"(");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,pvVar7->x);
      poVar2 = std::operator<<(poVar2,",");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,pvVar7->y);
      poVar2 = std::operator<<(poVar2,") ");
      poVar2 = std::operator<<(poVar2,"(");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,pvVar8->x);
      poVar2 = std::operator<<(poVar2,",");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,pvVar7->y);
      poVar2 = std::operator<<(poVar2,")");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    if (pvVar7->y != pvVar8->y) {
      poVar2 = std::operator<<(local_210,"V-line ");
      poVar2 = std::operator<<(poVar2,"(");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,pvVar8->x);
      poVar2 = std::operator<<(poVar2,",");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,pvVar7->y);
      poVar2 = std::operator<<(poVar2,") ");
      poVar2 = std::operator<<(poVar2,"(");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,pvVar8->x);
      poVar2 = std::operator<<(poVar2,",");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,pvVar8->y);
      poVar2 = std::operator<<(poVar2,")");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    local_244 = local_244 + 1;
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_210);
  return;
}

Assistant:

void Steiner::outfile(const string& outfileName) {
  ofstream of(outfileName, ofstream::out);
  of << "NumRoutedPins = " << _init_p << endl;
  of << "WireLength = " << _MRST_cost << endl;
  for (unsigned i = 0; i < _MST.size(); ++i) {
    if (_edges_del[_MST[i]]) continue;
    Point& p1 = _points[_edges[_MST[i]].p1];
    Point& p2 = _points[_edges[_MST[i]].p2];
    if (p1.x != p2.x) {
      of << "H-line "
         << "(" << p1.x << "," << p1.y << ") "
         << "(" << p2.x << "," << p1.y << ")"
         << endl;
    }
    if (p1.y != p2.y) {
      of << "V-line "
         << "(" << p2.x << "," << p1.y << ") "
         << "(" << p2.x << "," << p2.y << ")"
         << endl;
    }
  }
  for (unsigned i = 0; i < _newE.size(); ++i) {
    Point& p1 = _points[_newE[i].p1];
    Point& p2 = _points[_newE[i].p2];
    if (p1.x != p2.x) {
      of << "H-line "
         << "(" << p1.x << "," << p1.y << ") "
         << "(" << p2.x << "," << p1.y << ")"
         << endl;
    }
    if (p1.y != p2.y) {
      of << "V-line "
         << "(" << p2.x << "," << p1.y << ") "
         << "(" << p2.x << "," << p2.y << ")"
         << endl;
    }
  }
  of.close();
}